

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXRImageFromMemory(EXRImage *exr_image,EXRHeader *exr_header,uchar *memory,char **err)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  size_type sVar6;
  ulong uVar7;
  ulong uVar8;
  size_type __n;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> offsets;
  allocator_type local_41;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_40;
  
  if (exr_image == (EXRImage *)0x0 || memory == (uchar *)0x0) {
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar5 = "Invalid argument.";
LAB_0012833c:
    *err = pcVar5;
    return -3;
  }
  uVar1 = exr_header->header_len;
  if ((ulong)uVar1 == 0) {
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar5 = "EXRHeader is not initialized.";
    goto LAB_0012833c;
  }
  iVar2 = exr_header->compression_type;
  uVar7 = 0x10;
  if ((iVar2 != 3) && (iVar2 != 0x80)) {
    if (iVar2 == 4) {
      uVar7 = 0x20;
    }
    else {
      uVar7 = 1;
    }
  }
  __n = (size_type)exr_header->chunk_count;
  if ((long)__n < 1) {
    uVar4 = ((long)exr_header->data_window[3] - (long)exr_header->data_window[1]) + 1;
    if (exr_header->tiled == 0) {
      uVar3 = (ulong)(long)(int)uVar4 / uVar7;
      __n = uVar3 + (uVar7 * uVar3 < (ulong)(long)(int)uVar4);
    }
    else {
      uVar8 = (ulong)((exr_header->data_window[2] - exr_header->data_window[0]) + 1);
      uVar7 = uVar8 / (ulong)(long)exr_header->tile_size_x;
      uVar3 = uVar4 / (ulong)(long)exr_header->tile_size_y;
      __n = (uVar3 + ((long)exr_header->tile_size_y * uVar3 < uVar4)) *
            (uVar7 + ((long)exr_header->tile_size_x * uVar7 < uVar8));
    }
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
              (&local_40,__n,&local_41);
    if (__n == 0) goto LAB_00128414;
  }
  else {
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
              (&local_40,__n,&local_41);
  }
  sVar6 = 0;
  do {
    local_40.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_start[sVar6] =
         *(unsigned_long_long *)(memory + sVar6 * 8 + (ulong)uVar1 + 8);
    sVar6 = sVar6 + 1;
  } while (__n != sVar6);
LAB_00128414:
  tinyexr::DecodeChunk(exr_image,exr_header,&local_40,memory);
  if (local_40.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int LoadEXRImageFromMemory(EXRImage *exr_image, const EXRHeader *exr_header,
                           const unsigned char *memory, const char **err) {
  if (exr_image == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->header_len == 0) {
    if (err) {
      (*err) = "EXRHeader is not initialized.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const unsigned char *head = memory;
  const unsigned char *marker = reinterpret_cast<const unsigned char *>(
      memory + exr_header->header_len +
      8);  // +8 for magic number + version header.
  return tinyexr::DecodeEXRImage(exr_image, exr_header, head, marker, err);
}